

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O0

void json_add_bool(json_t *json,char *key,_Bool bvalue)

{
  char *__s;
  size_t sVar1;
  char *value;
  _Bool bvalue_local;
  char *key_local;
  json_t *json_local;
  
  json_check_comma(json);
  __s = "false";
  if (bvalue) {
    __s = "true";
  }
  if (key != (char *)0x0) {
    sVar1 = strlen(key);
    json_write_raw(json,key,sVar1,true,true);
    json_write_raw(json,":",1,false,false);
  }
  sVar1 = strlen(__s);
  json_write_raw(json,__s,sVar1,false,key == (char *)0x0);
  return;
}

Assistant:

void json_add_bool (json_t *json, const char *key, bool bvalue) {
    json_check_comma(json);
    
    const char *value = (bvalue) ? "true" : "false";

    if (key) {
        json_write_raw (json, key, strlen(key), true, true);
        JSON_WRITE_COLUMN;
    }
    
    json_write_raw(json, value, strlen(value), false, (key == NULL));
}